

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRoots.cpp
# Opt level: O0

void sort(int nx,double *x0,double *x1,double *x2)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  int in_EDI;
  
  if ((in_EDI == 2) && (*in_RDX <= *in_RSI && *in_RSI != *in_RDX)) {
    std::swap<double>(in_RSI,in_RDX);
  }
  if (in_EDI == 3) {
    if (*in_RDX <= *in_RSI && *in_RSI != *in_RDX) {
      std::swap<double>(in_RSI,in_RDX);
    }
    if (*in_RCX <= *in_RDX && *in_RDX != *in_RCX) {
      std::swap<double>(in_RDX,in_RCX);
    }
    if (*in_RDX <= *in_RSI && *in_RSI != *in_RDX) {
      std::swap<double>(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void
sort (int nx, double& x0, double& x1, double& x2)
{
    if (nx == 2)
    {
        if (x0 > x1) swap (x0, x1);
    }

    if (nx == 3)
    {
        if (x0 > x1) swap (x0, x1);
        if (x1 > x2) swap (x1, x2);
        if (x0 > x1) swap (x0, x1);
    }
}